

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerDeleteElemI(Lowerer *this,Instr *instr,bool strictMode)

{
  LowererMD *this_00;
  IRType IVar1;
  Instr *pIVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  IndirOpnd *this_01;
  undefined4 *puVar6;
  AddrOpnd *opndArg;
  IntConstOpnd *opndArg_00;
  RegOpnd *opndArg_01;
  JnHelperMethod local_34;
  
  this_01 = (IndirOpnd *)IR::Instr::UnlinkSrc1(instr);
  OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x26cc,"(src1->IsIndirOpnd())","Expected indirOpnd on DeleteElementI");
    if (!bVar5) goto LAB_005b0756;
    *puVar6 = 0;
  }
  pIVar2 = instr->m_prev;
  OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar5) goto LAB_005b0756;
    *puVar6 = 0;
  }
  opndArg = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(this_01);
  if (opndArg == (AddrOpnd *)0x0) {
    OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar5) goto LAB_005b0756;
      *puVar6 = 0;
    }
    opndArg = IR::AddrOpnd::NewFromNumber((long)this_01->m_offset,this->m_func,false);
LAB_005b0647:
    local_34 = HelperOp_DeleteElementI;
  }
  else {
    IVar1 = (opndArg->super_Opnd).m_type;
    if (IVar1 == TyInt32) {
      local_34 = HelperOp_DeleteElementI_Int32;
    }
    else {
      if (IVar1 != TyUint32) {
        if (IVar1 != TyVar) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x26e4,"(indexOpnd->GetType() == TyVar)",
                             "indexOpnd->GetType() == TyVar");
          if (!bVar5) goto LAB_005b0756;
          *puVar6 = 0;
        }
        goto LAB_005b0647;
      }
      local_34 = HelperOp_DeleteElementI_UInt32;
    }
  }
  this_00 = &this->m_lowererMD;
  opndArg_00 = IR::IntConstOpnd::New((ulong)strictMode,TyInt32,this->m_func,true);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg_00->super_Opnd);
  LoadScriptContext(this,instr);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg->super_Opnd);
  OVar4 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar5) {
LAB_005b0756:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  opndArg_01 = IR::IndirOpnd::UnlinkBaseOpnd(this_01);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg_01->super_Opnd);
  IR::Opnd::Free((Opnd *)this_01,this->m_func);
  LowererMD::ChangeToHelperCall
            (this_00,instr,local_34,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerDeleteElemI(IR::Instr * instr, bool strictMode)
{
    IR::Instr *instrPrev;

    IR::Opnd *src1 = instr->UnlinkSrc1();

    AssertMsg(src1->IsIndirOpnd(), "Expected indirOpnd on DeleteElementI");

    Js::PropertyOperationFlags propertyOperationFlag = Js::PropertyOperation_None;

    if (strictMode)
    {
        propertyOperationFlag = Js::PropertyOperation_StrictMode;
    }

    instrPrev = instr->m_prev;
    IR::JnHelperMethod helperMethod = IR::HelperOp_DeleteElementI;
    IR::Opnd *indexOpnd = src1->AsIndirOpnd()->UnlinkIndexOpnd();
    if (indexOpnd)
    {
        if (indexOpnd->GetType() == TyInt32)
        {
            helperMethod = IR::HelperOp_DeleteElementI_Int32;
        }
        else if (indexOpnd->GetType() == TyUint32)
        {
            helperMethod = IR::HelperOp_DeleteElementI_UInt32;
        }
        else
        {
            Assert(indexOpnd->GetType() == TyVar);
        }
    }
    else
    {
        // No index; the offset identifies the element.
        IntConstType offset = (IntConstType)src1->AsIndirOpnd()->GetOffset();
        indexOpnd = IR::AddrOpnd::NewFromNumber(offset, m_func);
    }

    m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New((IntConstType)propertyOperationFlag, TyInt32, m_func, true));
    LoadScriptContext(instr);
    m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    IR::Opnd *baseOpnd = src1->AsIndirOpnd()->UnlinkBaseOpnd();
    m_lowererMD.LoadHelperArgument(instr, baseOpnd);

    src1->Free(this->m_func);

    m_lowererMD.ChangeToHelperCall(instr, helperMethod);

    return instrPrev;
}